

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<8u,int,unsigned_int,int>::emplace_back<int_const&>
          (prevector<8u,int,unsigned_int,int> *this,int *args)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  prevector<8u,int,unsigned_int,int> *ppVar5;
  uint uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(uint *)(this + 0x20);
  uVar4 = uVar3 - 9;
  uVar1 = *(uint *)(this + 8);
  uVar6 = uVar4;
  if (uVar3 < 9) {
    uVar6 = uVar3;
    uVar1 = 8;
  }
  uVar6 = uVar6 + 1;
  if (uVar1 < uVar6) {
    prevector<8U,_int,_unsigned_int,_int>::change_capacity
              ((prevector<8U,_int,_unsigned_int,_int> *)this,(uVar6 >> 1) + uVar6);
    uVar3 = *(uint *)(this + 0x20);
    uVar4 = uVar3 - 9;
  }
  if (uVar3 < 9) {
    uVar4 = uVar3;
  }
  ppVar5 = *(prevector<8u,int,unsigned_int,int> **)this;
  if (uVar3 < 9) {
    ppVar5 = this;
  }
  *(int *)(ppVar5 + (long)(int)uVar4 * 4) = *args;
  *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace_back(Args&&... args) {
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        new(item_ptr(size())) T(std::forward<Args>(args)...);
        _size++;
    }